

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,
          REF_INT **g2l,REF_INT **l2g)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  REF_INT nodes [27];
  
  if (ref_cell->last_node_is_an_id == 0) {
    pcVar8 = "ref_cell with id expected";
    uVar7 = 0x1bf;
  }
  else {
    pRVar2 = ref_grid->node;
    uVar10 = (ulong)pRVar2->max;
    if (-1 < (long)uVar10) {
      pRVar4 = (REF_INT *)malloc(uVar10 * 4);
      *g2l = pRVar4;
      if (pRVar4 == (REF_INT *)0x0) {
        pcVar8 = "malloc *g2l of REF_INT NULL";
        uVar7 = 0x1c1;
      }
      else {
        for (uVar6 = 0; uVar6 < uVar10; uVar6 = uVar6 + 1) {
          pRVar4[uVar6] = -1;
        }
        *nnode = 0;
        *ncell = 0;
        for (iVar9 = 0; iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
          RVar3 = ref_cell_nodes(ref_cell,iVar9,nodes);
          if ((RVar3 == 0) && (nodes[ref_cell->node_per] == cell_id)) {
            *ncell = *ncell + 1;
            for (lVar5 = 0; lVar5 < ref_cell->node_per; lVar5 = lVar5 + 1) {
              if ((*g2l)[nodes[lVar5]] == -1) {
                iVar1 = *nnode;
                (*g2l)[nodes[lVar5]] = iVar1;
                *nnode = iVar1 + 1;
              }
            }
          }
        }
        if ((long)*nnode < 0) {
          pcVar8 = "malloc *l2g of REF_INT negative";
          uVar7 = 0x1d2;
          goto LAB_0014edcd;
        }
        pRVar4 = (REF_INT *)malloc((long)*nnode << 2);
        *l2g = pRVar4;
        if (pRVar4 != (REF_INT *)0x0) {
          *nnode = 0;
          iVar9 = 0;
          for (lVar5 = 0; lVar5 < pRVar2->max; lVar5 = lVar5 + 1) {
            if ((*g2l)[lVar5] != -1) {
              (*g2l)[lVar5] = iVar9;
              iVar9 = *nnode;
              pRVar4[iVar9] = (REF_INT)lVar5;
              iVar9 = iVar9 + 1;
              *nnode = iVar9;
            }
          }
          return 0;
        }
        pcVar8 = "malloc *l2g of REF_INT NULL";
        uVar7 = 0x1d2;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar7,
             "ref_grid_cell_id_nodes",pcVar8);
      return 2;
    }
    pcVar8 = "malloc *g2l of REF_INT negative";
    uVar7 = 0x1c1;
  }
LAB_0014edcd:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar7,
         "ref_grid_cell_id_nodes",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_id_nodes(REF_GRID ref_grid, REF_CELL ref_cell,
                                          REF_INT cell_id, REF_INT *nnode,
                                          REF_INT *ncell, REF_INT **g2l,
                                          REF_INT **l2g) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RAS(ref_cell_last_node_is_an_id(ref_cell), "ref_cell with id expected");

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}